

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_StageSetup(ARKodeMem ark_mem)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  pvVar3 = ark_mem->step_mem;
  if (pvVar3 == (void *)0x0) {
    iVar7 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0xfdd,"mriStep_StageSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    iVar7 = *(int *)((long)pvVar3 + 0xa0);
    puVar4 = *(undefined8 **)((long)pvVar3 + 0x1f8);
    dVar10 = ark_mem->h *
             *(double *)
              (*(long *)((long)pvVar3 + 0x80) +
              (long)*(int *)(*(long *)((long)pvVar3 + 0x68) + (long)iVar7 * 4) * 8);
    puVar5 = *(undefined8 **)((long)pvVar3 + 0x200);
    *(double *)((long)pvVar3 + 0xc0) = dVar10;
    if (ark_mem->firststage == 0) {
      dVar10 = dVar10 / *(double *)((long)pvVar3 + 200);
    }
    else {
      *(double *)((long)pvVar3 + 200) = dVar10;
      dVar10 = 1.0;
    }
    *(double *)((long)pvVar3 + 0xd0) = dVar10;
    *puVar5 = ark_mem->ycur;
    *puVar4 = 0x3ff0000000000000;
    puVar4[1] = 0xbff0000000000000;
    puVar5[1] = *(undefined8 *)((long)pvVar3 + 0x90);
    if (iVar7 < 1) {
      iVar6 = 2;
    }
    else {
      iVar1 = *(int *)((long)pvVar3 + 0x18);
      iVar2 = *(int *)((long)pvVar3 + 0x1c);
      iVar6 = 2;
      lVar9 = 0;
      do {
        if ((iVar1 != 0) &&
           (lVar8 = (long)*(int *)(*(long *)((long)pvVar3 + 0x68) + lVar9 * 4), -1 < lVar8)) {
          puVar4[iVar6] = ark_mem->h * *(double *)(*(long *)((long)pvVar3 + 0x78) + lVar8 * 8);
          puVar5[iVar6] = *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) + lVar8 * 8);
          iVar6 = iVar6 + 1;
        }
        if ((iVar2 != 0) &&
           (lVar8 = (long)*(int *)(*(long *)((long)pvVar3 + 0x68) + lVar9 * 4), -1 < lVar8)) {
          puVar4[iVar6] = ark_mem->h * *(double *)(*(long *)((long)pvVar3 + 0x80) + lVar8 * 8);
          puVar5[iVar6] = *(undefined8 *)(*(long *)((long)pvVar3 + 0x30) + lVar8 * 8);
          iVar6 = iVar6 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (iVar7 != lVar9);
    }
    iVar6 = N_VLinearCombination(iVar6,puVar4,puVar5,*(undefined8 *)((long)pvVar3 + 0x88));
    iVar7 = -0x1c;
    if (iVar6 == 0) {
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int mriStep_StageSetup(ARKodeMem ark_mem)
{
  /* local data */
  ARKodeMRIStepMem step_mem;
  int retval, i, j, nvec;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma (if the method contains an implicit component) */
  step_mem->gamma = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[i]];

  if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
  step_mem->gamrat = (ark_mem->firststage) ? ONE
                                           : step_mem->gamma / step_mem->gammap;

  /* set cvals and Xvecs for setting stage data */
  cvals[0] = ONE;
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = -ONE;
  Xvecs[1] = step_mem->zpred;
  nvec     = 2;

  for (j = 0; j < i; j++)
  {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1)
    {
      cvals[nvec] = ark_mem->h * step_mem->Ae_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[j]];
      nvec += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1)
    {
      cvals[nvec] = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[j]];
      nvec += 1;
    }
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* return with success */
  return (ARK_SUCCESS);
}